

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<double,_3,_1> __thiscall
Matrix<double,3,3>::operator*(Matrix<double,3,3> *this,Matrix<double,_3,_1> *matrix)

{
  double *pdVar1;
  ostream *poVar2;
  int row;
  int iVar3;
  int iVar4;
  double num;
  Matrix<double,_3,_1> MVar5;
  Matrix<double,_3,_1> local_50;
  double local_40;
  double local_38;
  
  if (matrix->rows != *(int *)(this + 4)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "you can not mutiply two matrix which the col of the first does not match the row of the second"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(-1);
  }
  local_50.rows = 3;
  local_50.cols = 1;
  local_50.data = (double *)operator_new__(0x18);
  iVar3 = *(int *)this;
  if (0 < iVar3) {
    iVar4 = matrix->cols;
    row = 0;
    do {
      if (0 < iVar4) {
        iVar3 = 0;
        do {
          if (*(int *)(this + 4) < 1) {
            num = 0.0;
          }
          else {
            num = 0.0;
            iVar4 = 0;
            do {
              local_38 = num;
              pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)this,row,iVar4);
              local_40 = *pdVar1;
              pdVar1 = Matrix<double,_3,_1>::operator()(matrix,iVar4,iVar3);
              num = local_38 + local_40 * *pdVar1;
              iVar4 = iVar4 + 1;
            } while (iVar4 < *(int *)(this + 4));
          }
          Matrix<double,_3,_1>::SetElement(&local_50,row,iVar3,num);
          iVar3 = iVar3 + 1;
          iVar4 = matrix->cols;
        } while (iVar3 < iVar4);
        iVar3 = *(int *)this;
      }
      row = row + 1;
    } while (row < iVar3);
  }
  MVar5.data = local_50.data;
  MVar5.rows = local_50.rows;
  MVar5.cols = local_50.cols;
  return MVar5;
}

Assistant:

int Matrix<Type, _0, _1>::row() const
{
    return this->rows;
}